

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_extract2(REF_DBL *m,REF_DBL *r,REF_DBL *s,REF_DBL *e)

{
  REF_DBL m3 [6];
  REF_DBL q [9];
  REF_DBL local_88;
  REF_DBL RStack_80;
  REF_DBL local_70;
  REF_DBL local_58;
  REF_DBL RStack_50;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL RStack_38;
  REF_DBL local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_58 = *r;
  RStack_50 = r[1];
  local_48 = r[2];
  local_40 = *s;
  RStack_38 = s[1];
  local_30 = s[2];
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  ref_matrix_jac_m_jact(&local_58,m,&local_88);
  *e = local_88;
  e[1] = RStack_80;
  e[2] = local_70;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_extract2(REF_DBL *m, REF_DBL *r, REF_DBL *s,
                                       REF_DBL *e) {
  REF_DBL q[9];
  REF_DBL m3[6];
  REF_INT i;
  for (i = 0; i < 3; i++) q[i] = r[i];
  for (i = 0; i < 3; i++) q[i + 3] = s[i];
  for (i = 0; i < 3; i++) q[i + 6] = 0;
  RSS(ref_matrix_jac_m_jact(q, m, m3), "trans");
  e[0] = m3[0];
  e[1] = m3[1];
  e[2] = m3[3];
  return REF_SUCCESS;
}